

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O3

void free_tree(dtree_t *tr)

{
  dtree_node_t *pdVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  
  if (tr->n_node != 0) {
    lVar3 = 0x28;
    uVar4 = 0;
    do {
      pdVar1 = tr->node;
      pvVar2 = *(void **)((long)pdVar1 + lVar3 + -0x10);
      if (pvVar2 != (void *)0x0) {
        ckd_free_3d(pvVar2);
      }
      pvVar2 = *(void **)((long)pdVar1 + lVar3 + -8);
      if (pvVar2 != (void *)0x0) {
        ckd_free_3d(pvVar2);
      }
      pvVar2 = *(void **)((long)&pdVar1->node_id + lVar3);
      if (pvVar2 != (void *)0x0) {
        ckd_free_3d(pvVar2);
      }
      pvVar2 = *(void **)((long)pdVar1 + lVar3 + -0x20);
      if (pvVar2 != (void *)0x0) {
        ckd_free(pvVar2);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x68;
    } while (uVar4 < tr->n_node);
  }
  ckd_free(tr->node);
  ckd_free(tr);
  return;
}

Assistant:

void
free_tree(dtree_t *tr)
{
    uint32 i;
    dtree_node_t *node;

    for (i = 0; i < tr->n_node; i++) {
	node = &tr->node[i];

	if (node->mixw_occ)
	    ckd_free_3d((void ***)node->mixw_occ);
	if (node->means)
	    ckd_free_3d((void ***)node->means);
	if (node->vars)
	    ckd_free_3d((void ***)node->vars);
	if (node->id)
	    ckd_free(node->id);

	/* node->q not freed because if tr is a
	   simple tree, it points to the question
	   in the master list of questions that needs
	   to stick around */
    }

    ckd_free(tr->node);

    ckd_free(tr);
}